

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_cookie_clearall(CookieInfo *cookies)

{
  uint i;
  long lVar1;
  
  if (cookies != (CookieInfo *)0x0) {
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
      Curl_cookie_freelist(cookies->cookies[lVar1]);
      cookies->cookies[lVar1] = (Cookie *)0x0;
    }
    cookies->numcookies = 0;
  }
  return;
}

Assistant:

void Curl_cookie_clearall(struct CookieInfo *cookies)
{
  if(cookies) {
    unsigned int i;
    for(i = 0; i < COOKIE_HASH_SIZE; i++) {
      Curl_cookie_freelist(cookies->cookies[i]);
      cookies->cookies[i] = NULL;
    }
    cookies->numcookies = 0;
  }
}